

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t __thiscall
c4::yml::Tree::lookup_path_or_modify(Tree *this,csubstr default_value,csubstr path,size_t start)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  csubstr *pcVar5;
  
  sVar4 = _lookup_path_or_create(this,path,start);
  bVar3 = has_parent(this,sVar4);
  if (!bVar3) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        sVar4 = (*pcVar2)();
        return sVar4;
      }
    }
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: has_parent(node)",0x1e,(anonymous_namespace)::s_default_callbacks);
  }
  if ((sVar4 == 0xffffffffffffffff) || (this->m_cap <= sVar4)) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        sVar4 = (*pcVar2)();
        return sVar4;
      }
    }
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  uVar1 = this->m_buf[sVar4].m_parent;
  if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        sVar4 = (*pcVar2)();
        return sVar4;
      }
    }
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((this->m_buf[uVar1].m_type.type & MAP) == NOTYPE) {
    to_val(this,sVar4,default_value,0);
  }
  else {
    pcVar5 = key(this,sVar4);
    to_keyval(this,sVar4,*pcVar5,default_value,0);
  }
  return sVar4;
}

Assistant:

size_t Tree::lookup_path_or_modify(csubstr default_value, csubstr path, size_t start)
{
    size_t target = _lookup_path_or_create(path, start);
    if(parent_is_map(target))
        to_keyval(target, key(target), default_value);
    else
        to_val(target, default_value);
    return target;
}